

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O0

bool __thiscall
tinyusdz::usdc::USDCReader::Impl::ReconstructPrimRecursively
          (Impl *this,int parent,int current,Prim *parentPrim,int level,
          PathIndexToSpecIndexMap *psmap,Stage *stage)

{
  int parent_00;
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  size_type sVar4;
  reference this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_02;
  const_reference pvVar5;
  size_type sVar6;
  mapped_type *pmVar7;
  string *psVar8;
  size_type sVar9;
  type *this_03;
  type *ptVar10;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *this_04;
  mapped_type *this_05;
  mapped_type *pmVar11;
  reference piVar12;
  string *psVar13;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
  *pmVar14;
  mapped_type *pmVar15;
  ulong uVar16;
  PrimMeta *pPVar17;
  mapped_type *pmVar18;
  PrimMeta *this_06;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *this_07;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *pvVar19;
  value_type *pvVar20;
  Prim *vp_1;
  ostringstream local_1d38 [8];
  ostringstream ss_w;
  VariantSet *vs_1;
  string variantName_1;
  string variantSetName_1;
  ostringstream local_1b58 [8];
  ostringstream ss_e_10;
  undefined1 local_19e0 [8];
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL> toks_1
  ;
  ostringstream local_1980 [8];
  ostringstream ss_e_9;
  Prim *vp;
  ostringstream local_17e0 [8];
  ostringstream ss_e_8;
  int *item_1;
  iterator __end3_1;
  iterator __begin3_1;
  mapped_type *__range3_1;
  ostringstream local_1628 [8];
  ostringstream ss_e_7;
  VariantSet *vs;
  string prop_name;
  pair<tinyusdz::Path,_tinyusdz::Property> *pp;
  ostringstream local_1460 [8];
  ostringstream ss_e_6;
  int *item;
  iterator __end3;
  iterator __begin3;
  mapped_type *__range3;
  Variant variant;
  string variantName;
  string variantSetName;
  ostringstream local_e28 [8];
  ostringstream ss_e_5;
  undefined1 local_cb0 [8];
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL> toks;
  ostringstream local_c50 [8];
  ostringstream ss_e_4;
  Prim *variantPrim;
  ostringstream local_ab0 [8];
  ostringstream ss_e_3;
  string local_938;
  ostringstream local_918 [8];
  ostringstream ss_e_2;
  ulong local_7a0;
  size_t i;
  Node *node;
  undefined1 local_788 [7];
  bool is_parent_variant;
  optional<tinyusdz::Prim> prim;
  Prim *currPrimPtr;
  __cxx11 local_408 [32];
  string local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  ostringstream local_348 [8];
  ostringstream ss_e_1;
  string local_1d0;
  ostringstream local_1b0 [8];
  ostringstream ss_e;
  PathIndexToSpecIndexMap *psmap_local;
  int level_local;
  Prim *parentPrim_local;
  int current_local;
  int parent_local;
  Impl *this_local;
  
  parentPrim_local._0_4_ = current;
  parentPrim_local._4_4_ = parent;
  _current_local = this;
  if ((int)(this->_config).kMaxPrimNestLevel < level) {
    ::std::__cxx11::ostringstream::ostringstream(local_1b0);
    poVar2 = ::std::operator<<((ostream *)local_1b0,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,"[USDC]");
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ReconstructPrimRecursively");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xcd7);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_1b0,"Prim hierarchy is too deep.");
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,&local_1d0);
    ::std::__cxx11::string::~string((string *)&local_1d0);
    this_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_1b0);
    goto LAB_001e04a9;
  }
  if ((current < 0) ||
     (sVar3 = ::std::
              vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
              ::size(&this->_nodes), (int)sVar3 <= current)) {
    ::std::__cxx11::ostringstream::ostringstream(local_348);
    poVar2 = ::std::operator<<((ostream *)local_348,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ReconstructPrimRecursively");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xce0);
    ::std::operator<<(poVar2," ");
    ::std::__cxx11::to_string(&local_3e8,(int)parentPrim_local);
    ::std::operator+((char *)&local_3c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "Invalid current node id: ");
    ::std::operator+(&local_3a8,&local_3c8,". Must be in range [0, ");
    sVar3 = ::std::
            vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
            ::size(&this->_nodes);
    std::__cxx11::to_string(local_408,sVar3);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_388
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_3a8);
    ::std::operator+(&local_368,&local_388,")");
    poVar2 = ::std::operator<<((ostream *)local_348,(string *)&local_368);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::~string((string *)&local_368);
    ::std::__cxx11::string::~string((string *)&local_388);
    ::std::__cxx11::string::~string((string *)local_408);
    ::std::__cxx11::string::~string((string *)&local_3a8);
    ::std::__cxx11::string::~string((string *)&local_3c8);
    ::std::__cxx11::string::~string((string *)&local_3e8);
    ::std::__cxx11::ostringstream::str();
    PushError(this,(string *)&currPrimPtr);
    ::std::__cxx11::string::~string((string *)&currPrimPtr);
    ::std::__cxx11::ostringstream::~ostringstream(local_348);
    this_local._7_1_ = 0;
    goto LAB_001e04a9;
  }
  prim.contained._840_8_ = 0;
  nonstd::optional_lite::optional<tinyusdz::Prim>::optional((optional<tinyusdz::Prim> *)local_788);
  sVar4 = ::std::
          map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
          ::count(&this->_variantPrims,(key_type_conflict2 *)((long)&parentPrim_local + 4));
  bVar1 = ReconstructPrimNode(this,parentPrim_local._4_4_,(int)parentPrim_local,level,sVar4 != 0,
                              psmap,stage,(optional<tinyusdz::Prim> *)local_788);
  if (bVar1) {
    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_788);
    if (bVar1) {
      prim.contained._840_8_ =
           nonstd::optional_lite::optional<tinyusdz::Prim>::value
                     ((optional<tinyusdz::Prim> *)local_788);
    }
    this_00 = ::std::
              vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
              ::operator[](&this->_nodes,(long)(int)parentPrim_local);
    local_7a0 = 0;
    while( true ) {
      this_01 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                crate::CrateReader::Node::GetChildren(this_00);
      sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(this_01);
      parent_00 = (int)parentPrim_local;
      if (sVar3 <= local_7a0) break;
      this_02 = crate::CrateReader::Node::GetChildren(this_00);
      pvVar5 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (this_02,local_7a0);
      bVar1 = ReconstructPrimRecursively
                        (this,parent_00,(int)*pvVar5,(Prim *)prim.contained._840_8_,level + 1,psmap,
                         stage);
      if (!bVar1) {
        this_local._7_1_ = 0;
        goto LAB_001e049d;
      }
      local_7a0 = local_7a0 + 1;
    }
    sVar6 = ::std::
            map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
            ::count(&this->_variantPropChildren,(key_type_conflict2 *)&parentPrim_local);
    if (sVar6 == 0) {
LAB_001dfc54:
      sVar6 = ::std::
              map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::count(&this->_variantPrimChildren,(key_type_conflict2 *)&parentPrim_local);
      if (sVar6 != 0) {
        bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_788);
        if (!bVar1) {
          ::std::__cxx11::ostringstream::ostringstream(local_1628);
          poVar2 = ::std::operator<<((ostream *)local_1628,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"ReconstructPrimRecursively");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xd52);
          ::std::operator<<(poVar2," ");
          poVar2 = ::std::operator<<((ostream *)local_1628,"Internal error: must be Prim.");
          ::std::operator<<(poVar2,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,(string *)&__range3_1);
          ::std::__cxx11::string::~string((string *)&__range3_1);
          this_local._7_1_ = 0;
          ::std::__cxx11::ostringstream::~ostringstream(local_1628);
          goto LAB_001e049d;
        }
        pmVar11 = ::std::
                  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ::at(&this->_variantPrimChildren,(key_type_conflict2 *)&parentPrim_local);
        __end3_1 = ::std::vector<int,_std::allocator<int>_>::begin(pmVar11);
        item_1 = (int *)::std::vector<int,_std::allocator<int>_>::end(pmVar11);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3_1,
                                  (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)&item_1), bVar1) {
          piVar12 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator*(&__end3_1);
          sVar4 = ::std::
                  map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
                  ::count(&this->_variantPrims,piVar12);
          if (sVar4 == 0) {
            ::std::__cxx11::ostringstream::ostringstream(local_17e0);
            poVar2 = ::std::operator<<((ostream *)local_17e0,"[error]");
            poVar2 = ::std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                      );
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = ::std::operator<<(poVar2,"ReconstructPrimRecursively");
            poVar2 = ::std::operator<<(poVar2,"():");
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xd5b);
            ::std::operator<<(poVar2," ");
            poVar2 = ::std::operator<<((ostream *)local_17e0,
                                       "Internal error: variant Prim children not found.");
            ::std::operator<<(poVar2,"\n");
            ::std::__cxx11::ostringstream::str();
            PushError(this,(string *)&vp);
            ::std::__cxx11::string::~string((string *)&vp);
            this_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_17e0);
            goto LAB_001e049d;
          }
          pmVar7 = ::std::
                   map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
                   ::at(&this->_variantPrims,piVar12);
          psVar8 = Prim::element_name_abi_cxx11_(pmVar7);
          bVar1 = is_variantElementName(psVar8);
          if (!bVar1) {
            ::std::__cxx11::ostringstream::ostringstream(local_1980);
            poVar2 = ::std::operator<<((ostream *)local_1980,"[error]");
            poVar2 = ::std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                      );
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = ::std::operator<<(poVar2,"ReconstructPrimRecursively");
            poVar2 = ::std::operator<<(poVar2,"():");
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xd64);
            ::std::operator<<(poVar2," ");
            poVar2 = ::std::operator<<((ostream *)local_1980,
                                       "Corrupted Crate. Variant Prim has invalid element_name.");
            ::std::operator<<(poVar2,"\n");
            ::std::__cxx11::ostringstream::str();
            PushError(this,(string *)&toks_1.field_0x38);
            ::std::__cxx11::string::~string((string *)&toks_1.field_0x38);
            this_local._7_1_ = 0;
            ::std::__cxx11::ostringstream::~ostringstream(local_1980);
            goto LAB_001e049d;
          }
          ::std::
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          ::array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                   *)local_19e0);
          psVar8 = Prim::element_name_abi_cxx11_(pmVar7);
          bVar1 = tokenize_variantElement
                            (psVar8,(array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>_conflict
                                     *)local_19e0);
          if (bVar1) {
            psVar13 = (string *)
                      ::std::
                      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                      ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                                    *)local_19e0,0);
            ::std::__cxx11::string::string
                      ((string *)(variantName_1.field_2._M_local_buf + 8),psVar13);
            psVar13 = (string *)
                      ::std::
                      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                      ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                                    *)local_19e0,1);
            ::std::__cxx11::string::string((string *)&vs_1,psVar13);
            pvVar20 = nonstd::optional_lite::optional<tinyusdz::Prim>::operator->
                                ((optional<tinyusdz::Prim> *)local_788);
            pmVar14 = Prim::variantSets_abi_cxx11_(pvVar20);
            pmVar15 = ::std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
                      ::operator[](pmVar14,(key_type *)((long)&variantName_1.field_2 + 8));
            uVar16 = ::std::__cxx11::string::empty();
            if ((uVar16 & 1) != 0) {
              ::std::__cxx11::string::operator=
                        ((string *)pmVar15,(string *)(variantName_1.field_2._M_local_buf + 8));
            }
            pPVar17 = Prim::metas(pmVar7);
            pmVar18 = ::std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>_>_>
                      ::operator[](&pmVar15->variantSet,(key_type *)&vs_1);
            this_06 = Variant::metas(pmVar18);
            PrimMetas::operator=(this_06,pPVar17);
            pvVar19 = Prim::children(pmVar7);
            pmVar18 = ::std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>_>_>
                      ::operator[](&pmVar15->variantSet,(key_type *)&vs_1);
            this_07 = Variant::primChildren(pmVar18);
            std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::operator=(this_07,pvVar19)
            ;
            ::std::__cxx11::string::~string((string *)&vs_1);
            ::std::__cxx11::string::~string((string *)(variantName_1.field_2._M_local_buf + 8));
            bVar1 = false;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_1b58);
            poVar2 = ::std::operator<<((ostream *)local_1b58,"[error]");
            poVar2 = ::std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                      );
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = ::std::operator<<(poVar2,"ReconstructPrimRecursively");
            poVar2 = ::std::operator<<(poVar2,"():");
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xd69);
            ::std::operator<<(poVar2," ");
            poVar2 = ::std::operator<<((ostream *)local_1b58,"Invalid variant element_name.");
            ::std::operator<<(poVar2,"\n");
            ::std::__cxx11::ostringstream::str();
            PushError(this,(string *)((long)&variantSetName_1.field_2 + 8));
            ::std::__cxx11::string::~string((string *)(variantSetName_1.field_2._M_local_buf + 8));
            this_local._7_1_ = 0;
            bVar1 = true;
            ::std::__cxx11::ostringstream::~ostringstream(local_1b58);
          }
          ::std::
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          ::~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                    *)local_19e0);
          if (bVar1) goto LAB_001e049d;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end3_1);
        }
      }
      if (parentPrim_local._4_4_ == 0) {
        bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_788);
        if (bVar1) {
          pvVar19 = Stage::root_prims(stage);
          pvVar20 = nonstd::optional_lite::optional<tinyusdz::Prim>::value
                              ((optional<tinyusdz::Prim> *)local_788);
          ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::
          emplace_back<tinyusdz::Prim>
                    ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)pvVar19,pvVar20);
        }
      }
      else {
        sVar4 = ::std::
                map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
                ::count(&this->_variantPrims,(key_type_conflict2 *)((long)&parentPrim_local + 4));
        if (sVar4 == 0) {
          bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_788);
          if ((bVar1) && (parentPrim != (Prim *)0x0)) {
            pvVar19 = Prim::children(parentPrim);
            pvVar20 = nonstd::optional_lite::optional<tinyusdz::Prim>::value
                                ((optional<tinyusdz::Prim> *)local_788);
            ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::
            emplace_back<tinyusdz::Prim>
                      ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)pvVar19,pvVar20);
          }
        }
        else {
          bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_788);
          if (bVar1) {
            pmVar7 = ::std::
                     map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
                     ::at(&this->_variantPrims,(key_type_conflict2 *)((long)&parentPrim_local + 4));
            pvVar19 = Prim::children(pmVar7);
            pvVar20 = nonstd::optional_lite::optional<tinyusdz::Prim>::value
                                ((optional<tinyusdz::Prim> *)local_788);
            ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::
            emplace_back<tinyusdz::Prim>
                      ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)pvVar19,pvVar20);
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_1d38);
            poVar2 = ::std::operator<<((ostream *)local_1d38,"[warn]");
            poVar2 = ::std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                      );
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = ::std::operator<<(poVar2,"ReconstructPrimRecursively");
            poVar2 = ::std::operator<<(poVar2,"():");
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xd85);
            ::std::operator<<(poVar2," ");
            poVar2 = ::std::operator<<((ostream *)local_1d38,
                                       "parent is variantPrim, but current is not Prim.");
            ::std::operator<<(poVar2,"\n");
            ::std::__cxx11::ostringstream::str();
            PushWarn(this,(string *)&vp_1);
            ::std::__cxx11::string::~string((string *)&vp_1);
            ::std::__cxx11::ostringstream::~ostringstream(local_1d38);
          }
        }
      }
      this_local._7_1_ = 1;
    }
    else {
      sVar4 = ::std::
              map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
              ::count(&this->_variantPrims,(key_type_conflict2 *)&parentPrim_local);
      if (sVar4 == 0) {
        ::std::__cxx11::ostringstream::ostringstream(local_918);
        poVar2 = ::std::operator<<((ostream *)local_918,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ReconstructPrimRecursively");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xd1b);
        ::std::operator<<(poVar2," ");
        poVar2 = ::std::operator<<((ostream *)local_918,
                                   "Internal error: variant attribute is not a child of VariantPrim."
                                  );
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,&local_938);
        ::std::__cxx11::string::~string((string *)&local_938);
        this_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_918);
      }
      else if (parentPrim == (Prim *)0x0) {
        ::std::__cxx11::ostringstream::ostringstream(local_ab0);
        poVar2 = ::std::operator<<((ostream *)local_ab0,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ReconstructPrimRecursively");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xd1f);
        ::std::operator<<(poVar2," ");
        poVar2 = ::std::operator<<((ostream *)local_ab0,"Internal error: parentPrim should exist.");
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)&variantPrim);
        ::std::__cxx11::string::~string((string *)&variantPrim);
        this_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_ab0);
      }
      else {
        pmVar7 = ::std::
                 map<int,_tinyusdz::Prim,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
                 ::at(&this->_variantPrims,(key_type_conflict2 *)&parentPrim_local);
        psVar8 = Prim::element_name_abi_cxx11_(pmVar7);
        bVar1 = is_variantElementName(psVar8);
        if (bVar1) {
          ::std::
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          ::array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                   *)local_cb0);
          psVar8 = Prim::element_name_abi_cxx11_(pmVar7);
          bVar1 = tokenize_variantElement
                            (psVar8,(array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>_conflict
                                     *)local_cb0);
          if (bVar1) {
            psVar13 = (string *)
                      ::std::
                      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                      ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                                    *)local_cb0,0);
            ::std::__cxx11::string::string((string *)(variantName.field_2._M_local_buf + 8),psVar13)
            ;
            psVar13 = (string *)
                      ::std::
                      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                      ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                                    *)local_cb0,1);
            ::std::__cxx11::string::string
                      ((string *)
                       &variant._primChildren.
                        super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,psVar13);
            Variant::Variant((Variant *)&__range3);
            pmVar11 = ::std::
                      map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                      ::at(&this->_variantPropChildren,(key_type_conflict2 *)&parentPrim_local);
            __end3 = ::std::vector<int,_std::allocator<int>_>::begin(pmVar11);
            item = (int *)::std::vector<int,_std::allocator<int>_>::end(pmVar11);
            while (bVar1 = __gnu_cxx::operator!=
                                     (&__end3,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                               *)&item), bVar1) {
              piVar12 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator*(&__end3);
              sVar9 = ::std::
                      map<int,_std::pair<tinyusdz::Path,_tinyusdz::Property>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<tinyusdz::Path,_tinyusdz::Property>_>_>_>
                      ::count(&this->_variantProps,piVar12);
              if (sVar9 == 0) {
                ::std::__cxx11::ostringstream::ostringstream(local_1460);
                poVar2 = ::std::operator<<((ostream *)local_1460,"[error]");
                poVar2 = ::std::operator<<(poVar2,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                          );
                poVar2 = ::std::operator<<(poVar2,":");
                poVar2 = ::std::operator<<(poVar2,"ReconstructPrimRecursively");
                poVar2 = ::std::operator<<(poVar2,"():");
                poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xd39);
                ::std::operator<<(poVar2," ");
                poVar2 = ::std::operator<<((ostream *)local_1460,
                                           "Internal error: variant Property not found.");
                ::std::operator<<(poVar2,"\n");
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)&pp);
                ::std::__cxx11::string::~string((string *)&pp);
                this_local._7_1_ = 0;
                bVar1 = true;
                ::std::__cxx11::ostringstream::~ostringstream(local_1460);
                goto LAB_001dfc12;
              }
              prop_name.field_2._8_8_ =
                   ::std::
                   map<int,_std::pair<tinyusdz::Path,_tinyusdz::Property>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<tinyusdz::Path,_tinyusdz::Property>_>_>_>
                   ::at(&this->_variantProps,piVar12);
              this_03 = ::std::get<0ul,tinyusdz::Path,tinyusdz::Property>
                                  ((pair<tinyusdz::Path,_tinyusdz::Property> *)
                                   prop_name.field_2._8_8_);
              psVar8 = Path::prop_part_abi_cxx11_(this_03);
              ::std::__cxx11::string::string((string *)&vs,(string *)psVar8);
              ptVar10 = ::std::get<1ul,tinyusdz::Path,tinyusdz::Property>
                                  ((pair<tinyusdz::Path,_tinyusdz::Property> *)
                                   prop_name.field_2._8_8_);
              this_04 = Variant::properties_abi_cxx11_((Variant *)&__range3);
              this_05 = ::std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                        ::operator[](this_04,(key_type *)&vs);
              Property::operator=(this_05,ptVar10);
              ::std::__cxx11::string::~string((string *)&vs);
              __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator++(&__end3);
            }
            pmVar14 = Prim::variantSets_abi_cxx11_(parentPrim);
            pmVar15 = ::std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
                      ::operator[](pmVar14,(key_type *)((long)&variantName.field_2 + 8));
            uVar16 = ::std::__cxx11::string::empty();
            if ((uVar16 & 1) != 0) {
              ::std::__cxx11::string::operator=
                        ((string *)pmVar15,(string *)(variantName.field_2._M_local_buf + 8));
            }
            pmVar18 = ::std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>_>_>
                      ::operator[](&pmVar15->variantSet,
                                   (key_type *)
                                   &variant._primChildren.
                                    super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
            Variant::operator=(pmVar18,(Variant *)&__range3);
            bVar1 = false;
LAB_001dfc12:
            Variant::~Variant((Variant *)&__range3);
            ::std::__cxx11::string::~string
                      ((string *)
                       &variant._primChildren.
                        super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
            ::std::__cxx11::string::~string((string *)(variantName.field_2._M_local_buf + 8));
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_e28);
            poVar2 = ::std::operator<<((ostream *)local_e28,"[error]");
            poVar2 = ::std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                      );
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = ::std::operator<<(poVar2,"ReconstructPrimRecursively");
            poVar2 = ::std::operator<<(poVar2,"():");
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xd2e);
            ::std::operator<<(poVar2," ");
            poVar2 = ::std::operator<<((ostream *)local_e28,"Invalid variant element_name.");
            ::std::operator<<(poVar2,"\n");
            ::std::__cxx11::ostringstream::str();
            PushError(this,(string *)((long)&variantSetName.field_2 + 8));
            ::std::__cxx11::string::~string((string *)(variantSetName.field_2._M_local_buf + 8));
            this_local._7_1_ = 0;
            bVar1 = true;
            ::std::__cxx11::ostringstream::~ostringstream(local_e28);
          }
          ::std::
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
          ::~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                    *)local_cb0);
          if (!bVar1) goto LAB_001dfc54;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_c50);
          poVar2 = ::std::operator<<((ostream *)local_c50,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"ReconstructPrimRecursively");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xd29);
          ::std::operator<<(poVar2," ");
          poVar2 = ::std::operator<<((ostream *)local_c50,
                                     "Corrupted Crate. VariantAttribute is not the child of VariantPrim."
                                    );
          ::std::operator<<(poVar2,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,(string *)&toks.field_0x38);
          ::std::__cxx11::string::~string((string *)&toks.field_0x38);
          this_local._7_1_ = 0;
          ::std::__cxx11::ostringstream::~ostringstream(local_c50);
        }
      }
    }
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_001e049d:
  nonstd::optional_lite::optional<tinyusdz::Prim>::~optional((optional<tinyusdz::Prim> *)local_788);
LAB_001e04a9:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool USDCReader::Impl::ReconstructPrimRecursively(
    int parent, int current, Prim *parentPrim, int level,
    const PathIndexToSpecIndexMap &psmap, Stage *stage) {
  if (level > int32_t(_config.kMaxPrimNestLevel)) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Prim hierarchy is too deep.");
  }

  DCOUT("ReconstructPrimRecursively: parent = "
        << std::to_string(parent) << ", current = " << current
        << ", level = " << std::to_string(level));

  if ((current < 0) || (current >= int(_nodes.size()))) {
    PUSH_ERROR("Invalid current node id: " + std::to_string(current) +
               ". Must be in range [0, " + std::to_string(_nodes.size()) + ")");
    return false;
  }

  //
  // TODO: Use bottom-up reconstruction(traverse child first)
  //

  // null : parent node is Property or other Spec type.
  // non-null : parent node is Prim
  Prim *currPrimPtr = nullptr;
  nonstd::optional<Prim> prim;

  bool is_parent_variant = _variantPrims.count(parent);

  if (!ReconstructPrimNode(parent, current, level, is_parent_variant, psmap,
                           stage, &prim)) {
    return false;
  }

  if (prim) {
    currPrimPtr = &(prim.value());
  }

  // Traverse children
  {
    const crate::CrateReader::Node &node = _nodes[size_t(current)];
    DCOUT("node.Children.size = " << node.GetChildren().size());
    for (size_t i = 0; i < node.GetChildren().size(); i++) {
      DCOUT("Reconstuct Prim children: " << i << " / "
                                         << node.GetChildren().size());
      if (!ReconstructPrimRecursively(current, int(node.GetChildren()[i]),
                                      currPrimPtr, level + 1, psmap, stage)) {
        return false;
      }
      DCOUT("DONE Reconstuct Prim children: " << i << " / "
                                              << node.GetChildren().size());
    }
  }

  //
  // Reonstruct variant
  //
  DCOUT(fmt::format("parent {}, current {}", parent, current));

  DCOUT(fmt::format("  has variant properties {}, has variant children {}",
    _variantPropChildren.count(current),
    _variantPrimChildren.count(current)));

  if (_variantPropChildren.count(current)) {

    // - parentPrim
    //   - variantPrim(SpecTypeVariant) <- current
    //     - variant property(SpecTypeAttribute)

    //
    // `current` must be VariantPrim and `parentPrim` should exist
    //
    if (!_variantPrims.count(current)) {
      PUSH_ERROR_AND_RETURN("Internal error: variant attribute is not a child of VariantPrim.");
    }

    if (!parentPrim) {
      PUSH_ERROR_AND_RETURN("Internal error: parentPrim should exist.");
    }

    const Prim &variantPrim = _variantPrims.at(current);

    DCOUT("variant prim name: " << variantPrim.element_name());


    // element_name must be variant: "{variant=value}"
    if (!is_variantElementName(variantPrim.element_name())) {
      PUSH_ERROR_AND_RETURN("Corrupted Crate. VariantAttribute is not the child of VariantPrim.");
    }

    std::array<std::string, 2> toks;
    if (!tokenize_variantElement(variantPrim.element_name(), &toks)) {
      PUSH_ERROR_AND_RETURN("Invalid variant element_name.");
    }

    std::string variantSetName = toks[0];
    std::string variantName = toks[1];

    Variant variant;

    for (const auto &item : _variantPropChildren.at(current)) {
      // item should exist in _variantProps.
      if (!_variantProps.count(item)) {
        PUSH_ERROR_AND_RETURN("Internal error: variant Property not found.");
      }
      const std::pair<Path, Property> &pp = _variantProps.at(item);

      std::string prop_name = std::get<0>(pp).prop_part();
      DCOUT(fmt::format("  node_index = {}, prop name {}", item, prop_name));

      variant.properties()[prop_name] = std::get<1>(pp);
    }

    VariantSet &vs = parentPrim->variantSets()[variantSetName];

    if (vs.name.empty()) {
      vs.name = variantSetName;
    }
    vs.variantSet[variantName] = variant;

  }

  if (_variantPrimChildren.count(current)) {

    // - currentPrim <- current
    //   - variant Prim children

    if (!prim) {
      PUSH_ERROR_AND_RETURN("Internal error: must be Prim.");
    }

    DCOUT(fmt::format("{} has variant Prim ", prim->element_name()));


    for (const auto &item : _variantPrimChildren.at(current)) {

      if (!_variantPrims.count(item)) {
        PUSH_ERROR_AND_RETURN("Internal error: variant Prim children not found.");
      }

      const Prim &vp = _variantPrims.at(item);

      DCOUT(fmt::format("  variantPrim name {}", vp.element_name()));

      // element_name must be variant: "{variant=value}"
      if (!is_variantElementName(vp.element_name())) {
        PUSH_ERROR_AND_RETURN("Corrupted Crate. Variant Prim has invalid element_name.");
      }

      std::array<std::string, 2> toks;
      if (!tokenize_variantElement(vp.element_name(), &toks)) {
        PUSH_ERROR_AND_RETURN("Invalid variant element_name.");
      }

      std::string variantSetName = toks[0];
      std::string variantName = toks[1];

      VariantSet &vs = prim->variantSets()[variantSetName];

      if (vs.name.empty()) {
        vs.name = variantSetName;
      }
      vs.variantSet[variantName].metas() = vp.metas();
      DCOUT("# of primChildren = " << vp.children().size());
      vs.variantSet[variantName].primChildren() = std::move(vp.children());

    }
  }

  if (parent == 0) {  // root prim
    if (prim) {
      stage->root_prims().emplace_back(std::move(prim.value()));
    }
  } else {
    if (_variantPrims.count(parent)) {
      // Add to variantPrim
      DCOUT("parent is variantPrim: " << parent);
      if (!prim) {
        // FIXME: Validate current should be Prim.
        PUSH_WARN("parent is variantPrim, but current is not Prim.");
      } else {
        DCOUT("Adding prim to child...");
        Prim &vp = _variantPrims.at(parent);
        vp.children().emplace_back(std::move(prim.value()));
      }
    } else if (prim && parentPrim) {
      // Add to parent prim.
      parentPrim->children().emplace_back(std::move(prim.value()));
    }
  }

  return true;
}